

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void prepareWriteRGB(vector<unsigned_char,_std::allocator<unsigned_char>_> *output,Image *image)

{
  pointer __src;
  long lVar1;
  size_t __n;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (output,(long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  __src = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_start;
  __n = (size_t)((image->size).width << 2);
  memcpy((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,__src,__n);
  for (lVar1 = 0;
      __n + lVar1 <
      (ulong)((long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_start); lVar1 = lVar1 + 1) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar1 + __n] = (&__src->r)[lVar1 + __n] - (&__src->r)[lVar1];
  }
  return;
}

Assistant:

void prepareWriteRGB(std::vector<uint8_t> &output, const Image &image) {
	output.resize(image.colorData.size() * sizeof(Color));
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(output.data(), start, scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		output[i] = start[i] - start[i - scanline];
	}
}